

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O3

QStringList * __thiscall
QStyleSheetStyleSelector::nodeNames
          (QStringList *__return_storage_ptr__,QStyleSheetStyleSelector *this,NodePtr node)

{
  char cVar1;
  int iVar2;
  long *plVar3;
  char *pcVar4;
  long lVar5;
  QString *args;
  storage_type *psVar6;
  storage_type *psVar7;
  long in_FS_OFFSET;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QString local_58;
  QArrayData *local_38;
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = (**(code **)(*(long *)this + 0x38))(this,node.ptr);
  if (cVar1 == '\0') {
    plVar3 = (long *)(*(code *)**node.ptr)(node.ptr);
    pcVar4 = (char *)QMetaObject::className();
    iVar2 = qstrcmp(pcVar4,"QTipLabel");
    if (iVar2 == 0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      (__return_storage_ptr__->d).size = 0;
      QVar9.m_data = (storage_type *)0x8;
      QVar9.m_size = (qsizetype)&local_38;
      QString::fromLatin1(QVar9);
      local_58.d.d = (Data *)local_38;
      local_58.d.ptr = pcStack_30;
      local_58.d.size = local_28;
      QtPrivate::QMovableArrayOps<QString>::emplace<QString>
                ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,&local_58);
      QList<QString>::end(__return_storage_ptr__);
      if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (QString *)0x0;
      (__return_storage_ptr__->d).size = 0;
      do {
        lVar5 = QMetaObject::className();
        if (lVar5 == 0) {
          psVar7 = (storage_type *)0x0;
        }
        else {
          psVar6 = (storage_type *)0xffffffffffffffff;
          do {
            psVar7 = psVar6 + 1;
            pcVar4 = psVar6 + lVar5 + 1;
            psVar6 = psVar7;
          } while (*pcVar4 != '\0');
        }
        QVar8.m_data = psVar7;
        QVar8.m_size = (qsizetype)&local_38;
        QString::fromLatin1(QVar8);
        args = (QString *)QString::replace((QChar)(char16_t)&local_38,(QChar)0x3a,0x2d);
        QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                  ((QMovableArrayOps<QString> *)__return_storage_ptr__,
                   (__return_storage_ptr__->d).size,args);
        QList<QString>::end(__return_storage_ptr__);
        if (local_38 != (QArrayData *)0x0) {
          LOCK();
          (local_38->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_38->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_38->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_38,2,0x10);
          }
        }
        plVar3 = (long *)*plVar3;
      } while (plVar3 != (long *)0x0);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0036d401;
  }
  else {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0036d401:
      __stack_chk_fail();
    }
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (QString *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

QStringList nodeNames(NodePtr node) const override
    {
        if (isNullNode(node))
            return QStringList();
        const QMetaObject *metaObject = OBJECT_PTR(node)->metaObject();
#if QT_CONFIG(tooltip)
        if (qstrcmp(metaObject->className(), "QTipLabel") == 0)
            return QStringList("QToolTip"_L1);
#endif
        QStringList result;
        do {
            result += QString::fromLatin1(metaObject->className()).replace(u':', u'-');
            metaObject = metaObject->superClass();
        } while (metaObject != nullptr);
        return result;
    }